

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

shared_ptr<mocker::ir::Reg> __thiscall
mocker::ir::FunctionModule::makeTempLocalReg(FunctionModule *this,string *hint)

{
  unsigned_long __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ir::Reg> sVar1;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *hint_local;
  FunctionModule *this_local;
  
  hint_local = hint;
  this_local = this;
  std::operator+(&local_60,in_RDX,"_");
  __val = *(unsigned_long *)((long)&hint[2].field_2 + 8);
  *(unsigned_long *)((long)&hint[2].field_2 + 8) = __val + 1;
  std::__cxx11::to_string(&local_80,__val);
  std::operator+(&local_40,&local_60,&local_80);
  std::make_shared<mocker::ir::Reg,std::__cxx11::string>(&this->identifier);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  sVar1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Reg>)
         sVar1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reg> FunctionModule::makeTempLocalReg(const std::string &hint) {
  return std::make_shared<Reg>(hint + "_" + std::to_string(tempRegCounter++));
}